

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageChannel.h
# Opt level: O0

void __thiscall
Imf_2_5::TypedDeepImageChannel<unsigned_int>::moveSampleList
          (TypedDeepImageChannel<unsigned_int> *this,size_t i,uint oldNumSamples,uint newNumSamples,
          size_t newSampleListPosition)

{
  uint *puVar1;
  uint *puVar2;
  uint j_2;
  uint j_1;
  uint j;
  uint *newSampleList;
  uint *oldSampleList;
  size_t newSampleListPosition_local;
  uint newNumSamples_local;
  uint oldNumSamples_local;
  size_t i_local;
  TypedDeepImageChannel<unsigned_int> *this_local;
  
  puVar1 = this->_sampleListPointers[i];
  puVar2 = this->_sampleBuffer + newSampleListPosition;
  if (newNumSamples < oldNumSamples) {
    for (j = 0; j < newNumSamples; j = j + 1) {
      puVar2[j] = puVar1[j];
    }
  }
  else {
    for (j_1 = 0; j_2 = oldNumSamples, j_1 < oldNumSamples; j_1 = j_1 + 1) {
      puVar2[j_1] = puVar1[j_1];
    }
    for (; j_2 < newNumSamples; j_2 = j_2 + 1) {
      puVar2[j_2] = 0;
    }
  }
  this->_sampleListPointers[i] = puVar2;
  return;
}

Assistant:

void
TypedDeepImageChannel<T>::moveSampleList
    (size_t i,
     unsigned int oldNumSamples,
     unsigned int newNumSamples,
     size_t newSampleListPosition)
{
    //
    // Resize the sample list for a single pixel and move it to a new
    // position in the sample buffer for this channel.
    // 
    // i                        The position of the affected pixel in
    //                          the channel's _sampleListPointers.
    //
    // oldNumSamples            Original number of samples in sample list.
    //
    // newNumSamples            New number of samples in the sample list.
    //                          If the new number of samples is larger than
    //                          the old number of samples for a given sample
    //                          list, then the end of the new sample list
    //                          is filled with zeroes.  If the new number of
    //                          samples is smaller than the old one, then
    //                          samples at the end of the old sample list
    //                          are discarded.
    //
    // newSampleListPosition    The new position of the sample list in the
    //                          sample buffer.
    //

    T * oldSampleList = _sampleListPointers[i];
    T * newSampleList = _sampleBuffer + newSampleListPosition;

    if (oldNumSamples > newNumSamples)
    {
        for (unsigned int j = 0; j < newNumSamples; ++j)
            newSampleList[j] = oldSampleList[j];
    }
    else
    {
        for (unsigned int j = 0; j < oldNumSamples; ++j)
            newSampleList[j] = oldSampleList[j];

        for (unsigned int j = oldNumSamples; j < newNumSamples; ++j)
            newSampleList[j] = 0;
    }

    _sampleListPointers[i] = newSampleList;
}